

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O2

DataType glu::getSampler1DArrayType(TextureFormat format)

{
  TextureChannelClass TVar1;
  undefined *puVar2;
  
  TVar1 = format.order - 0x12;
  if (TVar1 < TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    puVar2 = &DAT_00a1dfec;
  }
  else {
    TVar1 = tcu::getTextureChannelClass(format.type);
    if (TEXTURECHANNELCLASS_FLOATING_POINT < TVar1) {
      return TYPE_LAST;
    }
    puVar2 = &DAT_00a1dff8;
  }
  return *(DataType *)(puVar2 + (ulong)TVar1 * 4);
}

Assistant:

DataType getSampler1DArrayType (tcu::TextureFormat format)
{
	using tcu::TextureFormat;

	if (format.order == TextureFormat::D || format.order == TextureFormat::DS)
		return TYPE_SAMPLER_1D_ARRAY;

	if (format.order == TextureFormat::S)
		return TYPE_LAST;

	switch (tcu::getTextureChannelClass(format.type))
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return glu::TYPE_SAMPLER_1D_ARRAY;

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return glu::TYPE_INT_SAMPLER_1D_ARRAY;

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return glu::TYPE_UINT_SAMPLER_1D_ARRAY;

		default:
			return glu::TYPE_LAST;
	}
}